

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O1

void sexp_mark_one(sexp_conflict ctx,sexp_conflict *types,sexp_conflict x)

{
  sexp_mark_stack_ptr_t *psVar1;
  sexp_mark_stack_ptr_t **ppsVar2;
  sexp_conflict psVar3;
  sexp_mark_stack_ptr_t *psVar4;
  sexp_mark_stack_ptr_t *psVar5;
  long lVar6;
  sexp_conflict *ppsVar7;
  sexp_conflict *ppsVar8;
  sexp_gc_var_t *psVar9;
  sexp_mark_stack_ptr_t **ptr;
  sexp_conflict *ppsVar10;
  sexp_mark_stack_ptr_t *stack;
  
  if (((ulong)x & 3) == 0 && x != (sexp_conflict)0x0) {
    psVar1 = (ctx->value).context.mark_stack;
    ppsVar2 = &(ctx->value).context.mark_stack_ptr;
    while (x->markedp == '\0') {
      x->markedp = '\x01';
      if (x->tag == 0x24) {
        for (psVar9 = (x->value).context.saves; psVar9 != (sexp_gc_var_t *)0x0;
            psVar9 = psVar9->next) {
          if (psVar9->var != (sexp_conflict *)0x0) {
            sexp_mark_one(ctx,types,*psVar9->var);
          }
        }
      }
      psVar3 = types[x->tag];
      lVar6 = (long)(psVar3->value).type.field_len_base +
              (ulong)(psVar3->value).type.field_len_scale *
              *(long *)((long)&x->tag + (long)(psVar3->value).type.field_len_off) + -1;
      if (lVar6 < 0) {
        return;
      }
      ppsVar10 = (sexp_conflict *)((long)&x->tag + (long)(psVar3->value).type.field_base);
      ppsVar7 = ppsVar10 + lVar6;
      if (lVar6 != 0) {
        do {
          psVar3 = *ppsVar7;
          if ((((ulong)psVar3 & 3) == 0 && psVar3 != (sexp_conflict)0x0) &&
             (psVar3->markedp == '\0')) break;
          ppsVar7 = ppsVar7 + -1;
        } while (ppsVar10 < ppsVar7);
      }
      do {
        ppsVar8 = ppsVar7;
        if (ppsVar8 <= ppsVar10) goto LAB_0010ce76;
        ppsVar7 = ppsVar8 + -1;
      } while (*ppsVar8 == ppsVar8[-1]);
      psVar4 = *ppsVar2;
      psVar5 = psVar1;
      if ((psVar4 != (sexp_mark_stack_ptr_t *)0x0) &&
         (psVar5 = psVar4 + 1, psVar4 < psVar1 || ppsVar2 <= psVar5)) {
        psVar5 = (sexp_mark_stack_ptr_t *)malloc(0x18);
      }
      *ppsVar2 = psVar5;
      psVar5->start = ppsVar10;
      (*ppsVar2)->end = ppsVar8;
      (*ppsVar2)->prev = psVar4;
LAB_0010ce76:
      x = *ppsVar8;
      if (x == (sexp_conflict)0x0) {
        return;
      }
      if (((ulong)x & 3) != 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void sexp_mark_one (sexp ctx, sexp* types, sexp x) {
  sexp_sint_t len;
  sexp t, *p, *q;
  struct sexp_gc_var_t *saves;
 loop:
  if (!x || !sexp_pointerp(x) || !sexp_valid_object_p(ctx, x) || sexp_markedp(x))
    return;
  sexp_markedp(x) = 1;
  if (sexp_contextp(x)) {
    for (saves=sexp_context_saves(x); saves; saves=saves->next)
      if (saves->var) sexp_mark_one(ctx, types, *(saves->var));
  }
  t = types[sexp_pointer_tag(x)];
  len = sexp_type_num_slots_of_object(t, x) - 1;
  if (len >= 0) {
    p = (sexp*) (((char*)x) + sexp_type_field_base(t));
    q = p + len;
    while (p < q && (*q && sexp_pointerp(*q) ? sexp_markedp(*q) : 1))
      q--;                      /* skip trailing immediates */
    while (p < q && *q == q[-1])
      q--;                      /* skip trailing duplicates */
    if (p < q) {
      sexp_mark_stack_push(ctx, p, q);
    }
    x = *q;
    goto loop;
  }
}